

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

int RemoveClass(PClass *cls)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  AActor *this;
  undefined4 extraout_var;
  int iVar5;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_40;
  PClass *pPVar4;
  
  FThinkerIterator::FThinkerIterator(&local_40,cls,0x80);
  iVar5 = 0;
  bVar1 = false;
  while (bVar2 = bVar1, this = (AActor *)FThinkerIterator::Next(&local_40), this != (AActor *)0x0) {
    pPVar4 = (this->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (this->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar1 = bVar2;
    if ((pPVar4 == cls) && (bVar1 = true, this->player == (player_t *)0x0)) {
      iVar5 = iVar5 + 1;
      AActor::ClearCounters(this);
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      bVar1 = bVar2;
    }
  }
  if (bVar2) {
    Printf("Cannot remove live players!\n");
  }
  return iVar5;
}

Assistant:

static int RemoveClass(const PClass *cls)
{
	AActor *actor;
	int removecount = 0;
	bool player = false;
	TThinkerIterator<AActor> iterator(cls);
	while ((actor = iterator.Next()))
	{
		if (actor->IsA(cls))
		{
			// [MC]Do not remove LIVE players.
			if (actor->player != NULL)
			{
				player = true;
				continue;
			}
			removecount++; 
			actor->ClearCounters();
			actor->Destroy();
		}
	}
	if (player)
		Printf("Cannot remove live players!\n");
	return removecount;

}